

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void zeroPage(MemPage *pPage,int flags)

{
  u8 *puVar1;
  byte bVar2;
  uint uVar3;
  BtShared *pBVar4;
  u8 *puVar5;
  int iVar6;
  bool bVar7;
  
  pBVar4 = pPage->pBt;
  puVar5 = pPage->aData;
  bVar2 = pPage->hdrOffset;
  if ((pBVar4->btsFlags & 0xc) != 0) {
    memset(puVar5 + bVar2,0,(ulong)(pBVar4->usableSize - (uint)bVar2));
  }
  puVar5[bVar2] = (u8)flags;
  bVar7 = (flags & 8U) == 0;
  puVar1 = puVar5 + (ulong)bVar2 + 1;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  iVar6 = (uint)bVar2 + (uint)bVar7 * 4 + 8;
  puVar5[(ulong)bVar2 + 7] = '\0';
  puVar5[(ulong)bVar2 + 5] = *(u8 *)((long)&pBVar4->usableSize + 1);
  puVar5[(ulong)bVar2 + 6] = (u8)pBVar4->usableSize;
  pPage->nFree = pBVar4->usableSize - iVar6 & 0xffff;
  decodeFlags(pPage,flags);
  pPage->cellOffset = (u16)iVar6;
  uVar3 = pBVar4->pageSize;
  pPage->aDataEnd = puVar5 + uVar3;
  pPage->aCellIdx = puVar5 + (ulong)((uint)bVar2 + (uint)bVar7 * 4) + 8;
  pPage->aDataOfst = puVar5 + pPage->childPtrSize;
  pPage->nOverflow = '\0';
  pPage->maskPage = (short)uVar3 - 1;
  pPage->nCell = 0;
  pPage->isInit = '\x01';
  return;
}

Assistant:

static void zeroPage(MemPage *pPage, int flags){
  unsigned char *data = pPage->aData;
  BtShared *pBt = pPage->pBt;
  u8 hdr = pPage->hdrOffset;
  u16 first;

  assert( sqlite3PagerPagenumber(pPage->pDbPage)==pPage->pgno || CORRUPT_DB );
  assert( sqlite3PagerGetExtra(pPage->pDbPage) == (void*)pPage );
  assert( sqlite3PagerGetData(pPage->pDbPage) == data );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( sqlite3_mutex_held(pBt->mutex) );
  if( pBt->btsFlags & BTS_FAST_SECURE ){
    memset(&data[hdr], 0, pBt->usableSize - hdr);
  }
  data[hdr] = (char)flags;
  first = hdr + ((flags&PTF_LEAF)==0 ? 12 : 8);
  memset(&data[hdr+1], 0, 4);
  data[hdr+7] = 0;
  put2byte(&data[hdr+5], pBt->usableSize);
  pPage->nFree = (u16)(pBt->usableSize - first);
  decodeFlags(pPage, flags);
  pPage->cellOffset = first;
  pPage->aDataEnd = &data[pBt->pageSize];
  pPage->aCellIdx = &data[first];
  pPage->aDataOfst = &data[pPage->childPtrSize];
  pPage->nOverflow = 0;
  assert( pBt->pageSize>=512 && pBt->pageSize<=65536 );
  pPage->maskPage = (u16)(pBt->pageSize - 1);
  pPage->nCell = 0;
  pPage->isInit = 1;
}